

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O0

void __thiscall lineage::SolutionGraph::save(SolutionGraph *this,string *fileNamePrefix)

{
  bool bVar1;
  size_t sVar2;
  Problem *pPVar3;
  const_reference pvVar4;
  ostream *poVar5;
  void *this_00;
  reference puVar6;
  long in_RDI;
  size_t j;
  size_t c_1;
  ofstream file_2;
  unsigned_long *v_1;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  size_t c;
  ofstream file_1;
  size_t v;
  ofstream file;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff848;
  SolutionGraph *in_stack_fffffffffffff850;
  char *in_stack_fffffffffffff870;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  ulong local_6e0;
  ulong local_6d8;
  string local_6d0 [32];
  undefined1 local_6b0 [280];
  Solution *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4a0;
  const_reference local_498;
  ulong local_490;
  string local_488 [32];
  ostream local_468 [512];
  string local_268 [32];
  ulong local_248;
  string local_230 [32];
  undefined1 local_210 [528];
  
  std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  std::ofstream::ofstream(local_210,local_230,_S_out);
  std::__cxx11::string::~string(local_230);
  local_248 = 0;
  while( true ) {
    uVar7 = local_248;
    sVar2 = numberOfNodes((SolutionGraph *)0x1893ed);
    if (sVar2 <= uVar7) break;
    pPVar3 = problem((SolutionGraph *)0x18940e);
    pvVar4 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                       (&pPVar3->nodes,local_248);
    poVar5 = (ostream *)std::ostream::operator<<(local_210,pvVar4->t);
    poVar5 = std::operator<<(poVar5,'\t');
    pPVar3 = problem((SolutionGraph *)0x189460);
    pvVar4 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                       (&pPVar3->nodes,local_248);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar4->id);
    poVar5 = std::operator<<(poVar5,'\t');
    sVar2 = cellOfNode(in_stack_fffffffffffff850,(size_t)in_stack_fffffffffffff848);
    this_00 = (void *)std::ostream::operator<<(poVar5,sVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_248 = local_248 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  saveSolution(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::__cxx11::string::~string(local_268);
  std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  std::ofstream::ofstream(local_468,local_488,_S_out);
  std::__cxx11::string::~string(local_488);
  local_490 = 0;
  while( true ) {
    uVar7 = local_490;
    sVar2 = numberOfCells((SolutionGraph *)0x18963c);
    if (sVar2 <= uVar7) break;
    local_498 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RDI + 0x60),local_490);
    local_4a0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffff848);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffff848);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff850,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff848);
      if (!bVar1) break;
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_4a0);
      poVar5 = std::operator<<(local_468,"(");
      pPVar3 = problem((SolutionGraph *)0x1896fc);
      pvVar4 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                         (&pPVar3->nodes,*puVar6);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar4->t);
      poVar5 = std::operator<<(poVar5," ");
      pPVar3 = problem((SolutionGraph *)0x189747);
      pvVar4 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                         (&pPVar3->nodes,*puVar6);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar4->id);
      std::operator<<(poVar5,") ");
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_4a0);
    }
    std::ostream::operator<<(local_468,std::endl<char,std::char_traits<char>>);
    local_490 = local_490 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_468);
  std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  std::ofstream::ofstream(local_6b0,local_6d0,_S_out);
  std::__cxx11::string::~string(local_6d0);
  local_6d8 = 0;
  while( true ) {
    sVar2 = numberOfCells((SolutionGraph *)0x1898c1);
    if (sVar2 <= local_6d8) break;
    local_6e0 = 0;
    while( true ) {
      uVar7 = local_6e0;
      sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              numberOfEdgesFromVertex
                        ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                         in_stack_fffffffffffff850,(size_t)in_stack_fffffffffffff848);
      if (sVar2 <= uVar7) break;
      poVar5 = (ostream *)std::ostream::operator<<(local_6b0,local_6d8);
      poVar5 = std::operator<<(poVar5,'\t');
      sVar2 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              vertexFromVertex((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                               in_stack_fffffffffffff850,(size_t)in_stack_fffffffffffff848,0x18997a)
      ;
      in_stack_fffffffffffff850 = (SolutionGraph *)std::ostream::operator<<(poVar5,sVar2);
      std::ostream::operator<<(in_stack_fffffffffffff850,std::endl<char,std::char_traits<char>>);
      local_6e0 = local_6e0 + 1;
    }
    local_6d8 = local_6d8 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_6b0);
  return;
}

Assistant:

void save(std::string const& fileNamePrefix = "lineage") const
    {
        {
            std::ofstream file(fileNamePrefix + "-fragment-node-labels.txt");
            for (size_t v = 0; v < numberOfNodes(); ++v)
                file << problem().nodes[v].t
                    << '\t' << problem().nodes[v].id
                    << '\t' << cellOfNode(v)
                    << std::endl;
            
            file.close();
        }

        saveSolution(fileNamePrefix + "-fragment-edge-labels.txt", solution_);

        {
            std::ofstream file(fileNamePrefix + "-cell-nodes.txt");
            for(size_t c = 0; c < numberOfCells(); ++c)
            {
                for(auto& v: nodesOfCell_[c])
                    file << "(" << problem().nodes[v].t
                        << " " << problem().nodes[v].id
                        << ") ";
                
                file << std::endl;
            }

            file.close();
        }
        {
            std::ofstream file(fileNamePrefix + "-cell-edges.txt");
            for(size_t c = 0; c < numberOfCells(); ++c)
                for(size_t j = 0; j < lineageGraph_.numberOfEdgesFromVertex(c); ++j)
                    file << c << '\t' << lineageGraph_.vertexFromVertex(c, j) << std::endl;

            file.close();
        }
    }